

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.cpp
# Opt level: O3

void puppup::movegen::__impl::gen
               (Rack *r,idx step,idx cursor,idx orig_cursor,nodeid node,Gaddag *gaddag,State *state,
               idx non_multipliable_score,idx multipliable_score,idx word_mult,
               vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> *outputs,
               bool best_only,array<long,_16384UL> *orthogonal_memo,idx blanks,idx placed)

{
  pointer *ppMVar1;
  long lVar2;
  State *pSVar3;
  bool bVar4;
  idx non_multipliable_score_00;
  Rack *pRVar5;
  iterator __position;
  long lVar6;
  vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> *pvVar7;
  bool best_only_local;
  idx local_108;
  long local_100;
  idx local_f8;
  idx local_f0;
  chr local_e8;
  nodeid local_e0;
  nodeid node_local;
  idx word_mult_new;
  idx orig_cursor_local;
  idx cursor_local;
  idx step_local;
  anon_class_128_16_5f1c26f7 evaluate;
  
  non_multipliable_score_00 = non_multipliable_score;
  local_f8 = blanks;
  best_only_local = best_only;
  local_f0 = placed;
  lVar6 = multipliable_score;
  local_e0 = node;
  node_local = node;
  orig_cursor_local = orig_cursor;
  cursor_local = cursor;
  step_local = step;
  if (step < 0 && cursor != orig_cursor) {
    lVar2 = (gaddag->nodes_).
            super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
            ._M_impl.super__Vector_impl_data._M_start[node].children._M_elems[0x1f];
    if ((lVar2 != -1) &&
       (((0xf0 < (ulong)cursor || (cursor & 0x800000000000000fU) == 0xf ||
         (*(long *)(board::word_multiplier + cursor * 8) == 0)) ||
        ((state->board)._M_elems[cursor] == 0x1b)))) {
      local_100 = multipliable_score;
      local_108 = orig_cursor;
      gen(r,-step,orig_cursor - step,orig_cursor,lVar2,gaddag,state,non_multipliable_score,
          multipliable_score,word_mult,outputs,best_only,orthogonal_memo,blanks,placed);
      lVar6 = local_100;
      orig_cursor = local_108;
    }
  }
  else if (((0 < step && 0 < placed) &&
           (pSVar3 = (State *)(gaddag->node_to_word_).
                              super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start[node],
           pSVar3 != (State *)0xffffffffffffffff)) &&
          ((0xf0 < (ulong)cursor || (cursor & 0x800000000000000fU) == 0xf ||
           ((*(long *)(board::word_multiplier + cursor * 8) == 0 ||
            ((state->board)._M_elems[cursor] == 0x1b)))))) {
    lVar2 = multipliable_score * word_mult + 0x23;
    if ((ulong)placed < 7) {
      lVar2 = multipliable_score * word_mult;
    }
    pRVar5 = (Rack *)(lVar2 + non_multipliable_score);
    if (best_only) {
      __position._M_current =
           (outputs->
           super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if ((outputs->
          super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>)._M_impl
          .super__Vector_impl_data._M_start != __position._M_current) {
        if (__position._M_current[-1].score < (long)pRVar5) {
          __position._M_current[-1].score = (idx)pRVar5;
          __position._M_current[-1].word = (idx)pSVar3;
          __position._M_current[-1].cursor = cursor;
          __position._M_current[-1].step = step;
          __position._M_current[-1].blanks = blanks;
        }
        goto LAB_0010b177;
      }
    }
    else {
      __position._M_current =
           (outputs->
           super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    evaluate.blanks = (idx *)blanks;
    evaluate.r = pRVar5;
    evaluate.state = pSVar3;
    evaluate.cursor = (idx *)cursor;
    evaluate.j = (chr *)step;
    if (__position._M_current ==
        (outputs->super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>)
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_100 = multipliable_score;
      local_108 = orig_cursor;
      std::vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>::
      _M_realloc_insert<puppup::movegen::Move>(outputs,__position,(Move *)&evaluate);
      lVar6 = local_100;
      orig_cursor = local_108;
    }
    else {
      (__position._M_current)->blanks = blanks;
      (__position._M_current)->score = (idx)pRVar5;
      (__position._M_current)->word = (idx)pSVar3;
      (__position._M_current)->cursor = cursor;
      (__position._M_current)->step = step;
      ppMVar1 = &(outputs->
                 super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppMVar1 = *ppMVar1 + 1;
    }
  }
LAB_0010b177:
  if (((ulong)cursor < 0xf1 && (cursor & 0x800000000000000fU) != 0xf) &&
     (*(long *)(board::word_multiplier + cursor * 8) != 0)) {
    lVar2 = (state->board)._M_elems[cursor];
    if (lVar2 == 0x1b) {
      word_mult_new = *(long *)(board::word_multiplier + cursor * 8) * word_mult;
      local_e8 = 0;
      pvVar7 = outputs;
      do {
        if ((gaddag->nodes_).
            super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
            ._M_impl.super__Vector_impl_data._M_start[node_local].children._M_elems[local_e8] != -1)
        {
          evaluate.cursor = &cursor_local;
          evaluate.j = &local_e8;
          evaluate.state = state;
          evaluate.blanks = &blanks;
          evaluate.step = &step_local;
          evaluate.orthogonal_memo = orthogonal_memo;
          evaluate.orig_cursor = &orig_cursor_local;
          evaluate.node = &node_local;
          evaluate.non_multipliable_score = &non_multipliable_score;
          evaluate.word_mult_new = &word_mult_new;
          evaluate.r = r;
          evaluate.gaddag = gaddag;
          evaluate.multipliable_score = &multipliable_score;
          evaluate.outputs = pvVar7;
          evaluate.best_only = &best_only_local;
          evaluate.placed = &placed;
          if (r->_M_elems[local_e8] != 0) {
            gen::anon_class_128_16_5f1c26f7::operator()(&evaluate,local_e8);
            pvVar7 = outputs;
          }
          if (r->_M_elems[0x1a] != 0) {
            gen::anon_class_128_16_5f1c26f7::operator()(&evaluate,0x1a);
            pvVar7 = outputs;
          }
        }
        bVar4 = local_e8 < 0x1a;
        local_e8 = local_e8 + 1;
      } while (bVar4);
    }
    else {
      lVar2 = (gaddag->nodes_).
              super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
              ._M_impl.super__Vector_impl_data._M_start[local_e0].children._M_elems[lVar2];
      if (lVar2 != -1) {
        gen(r,step,step + cursor,orig_cursor,lVar2,gaddag,state,non_multipliable_score_00,
            lVar6 + (state->letter_score)._M_elems[cursor],word_mult,outputs,best_only,
            orthogonal_memo,local_f8,local_f0);
      }
    }
  }
  return;
}

Assistant:

void gen(Rack& r, idx step, idx cursor, idx orig_cursor, trie::nodeid node,
         const trie::Gaddag& gaddag, board::State& state,
         idx non_multipliable_score, idx multipliable_score, idx word_mult,
         std::vector<Move>& outputs, const bool best_only,
         std::array<idx, 256 * 32 * 2>& orthogonal_memo, idx blanks,
         idx placed) {
    // we have gone far enough in the reverse direction, time to turn around
    if (cursor != orig_cursor && step < 0 &&
        (gaddag.has(node, trie::rev_marker) &&
         (edge(cursor) || state.board[cursor] == emptiness))) {
        gen(r, -step, orig_cursor - step, orig_cursor,
            gaddag.get(node, trie::rev_marker), gaddag, state,
            non_multipliable_score, multipliable_score, word_mult, outputs,
            best_only, orthogonal_memo, blanks, placed);
    }
    // we have found a valid word
    if (placed > 0 && step > 0 && gaddag.exists(node) &&
        (edge(cursor) || state.board[cursor] == emptiness)) {
        idx score = non_multipliable_score + multipliable_score * word_mult;
        if (placed >= 7) score += bingo_bonus;
        if (!best_only || outputs.empty()) {
            outputs.push_back(
                {score, gaddag.nodeToWord(node), cursor, step, blanks});
        } else {
            if (score > outputs.back().score) {
                outputs.back() = {score, gaddag.nodeToWord(node), cursor, step,
                                  blanks};
            }
        }
    }
    // we have gone out of bounds
    if (edge(cursor)) {
        return;
    }
    // traverse over undiscovered land
    if (state.board[cursor] == emptiness) {
        idx word_mult_new = word_mult * board::word_multiplier[cursor];
        /*
        for (trie::nodeid child = gaddag.firstChild(node);
             child != trie::invalid; child = gaddag.nextSibling(child)) {
            chr j = gaddag.val(child);
            if (j >= emptiness) break;
            */
        for (chr j = 0; j < emptiness; ++j) {
            if (!gaddag.has(node, j)) continue;
            auto evaluate = [&](const chr i) {
                --r[i];
                state.board[cursor] = j;
                state.letter_score[cursor] = scores[i];
                idx newblanks = blanks;
                idx blankness = 0;
                if (i == blank) {
                    blankness = 1;
                    newblanks <<= idx(16LL);
                    newblanks |= cursor + 1;
                }
                idx orth_score =
                    orthogonal_memo[2 * (cursor * 32 + j) + blankness];
                if (orth_score == -2) {
                    orth_score = orthogonal(turn(step), cursor, gaddag, state);
                    orthogonal_memo[2 * (cursor * 32 + j) + blankness] =
                        orth_score;
                }
                if (orth_score >= 0) {
                    gen(r, step, cursor + step, orig_cursor,
                        gaddag.get(node, j), gaddag, state,
                        non_multipliable_score + orth_score,
                        multipliable_score +
                            scores[i] * board::letter_multiplier[cursor],
                        word_mult_new, outputs, best_only, orthogonal_memo,
                        newblanks, placed + 1);
                }
                state.board[cursor] = emptiness;
                state.letter_score[cursor] = 0;
                ++r[i];
            };
            if (r[j]) evaluate(j);
            if (r[blank]) evaluate(blank);
        }
    } else {
        // traverse over existing tiles
        const chr i = state.board[cursor];
        if (gaddag.has(node, i)) {
            gen(r, step, cursor + step, orig_cursor, gaddag.get(node, i),
                gaddag, state, non_multipliable_score,
                multipliable_score + state.letter_score[cursor], word_mult,
                outputs, best_only, orthogonal_memo, blanks, placed);
        }
    }
}